

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O3

char duckdb::Cast::Operation<unsigned_short,signed_char>(unsigned_short input)

{
  bool bVar1;
  unkbyte10 Var2;
  char result;
  char local_39;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_short,signed_char>(input,&local_39,false);
  if (bVar1) {
    return local_39;
  }
  Var2 = __cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_short,signed_char>
            (&local_38,(duckdb *)(ulong)input,(unsigned_short)((unkuint10)Var2 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var2,&local_38);
  __cxa_throw((InvalidInputException *)Var2,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}